

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O1

void DumpGraph(ScopeData *scope)

{
  ExpressionGraphContext exprGraphCtx;
  OutputContext outputCtx;
  char tempBuf [4096];
  char outputBuf [4096];
  ExpressionContext exprCtx;
  ExpressionGraphContext local_ace0;
  OutputContext local_acc8;
  char local_aa88 [4096];
  char local_9a88 [4104];
  ExpressionContext local_8a80;
  
  ExpressionContext::ExpressionContext(&local_8a80,(Allocator *)0x0,0);
  local_acc8.stream = (void *)0x0;
  local_acc8.openStream = OutputContext::FileOpen;
  local_acc8.writeStream = OutputContext::FileWrite;
  local_acc8.closeStream = OutputContext::FileClose;
  local_acc8.outputBufSize = 0x1000;
  local_acc8.outputBufPos = 0;
  local_acc8.outputBuf = local_9a88;
  local_acc8.tempBuf = local_aa88;
  local_acc8.tempBufSize = 0x1000;
  local_acc8.stream = fopen("expr_graph.txt","w");
  local_acc8.writeStream = OutputContext::FileWrite;
  local_ace0.depth = 0;
  local_ace0.skipImported = false;
  local_ace0.skipFunctionDefinitions = false;
  local_ace0.ctx = &local_8a80;
  local_ace0.output = &local_acc8;
  PrintGraph(&local_ace0,scope,true);
  PrintGraph(&local_ace0,scope,false);
  fclose((FILE *)local_acc8.stream);
  local_acc8.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_acc8);
  ExpressionContext::~ExpressionContext(&local_8a80);
  return;
}

Assistant:

void DumpGraph(ScopeData *scope)
{
	ExpressionContext exprCtx(0, 0);
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("expr_graph.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	ExpressionGraphContext exprGraphCtx(exprCtx, outputCtx);

	PrintGraph(exprGraphCtx, scope, true);

	PrintGraph(exprGraphCtx, scope, false);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}